

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstylesheetstyle.cpp
# Opt level: O2

QHash<QStyle::SubControl,_QRect> __thiscall
QStyleSheetStyle::titleBarLayout(QStyleSheetStyle *this,QWidget *w,QStyleOptionTitleBar *tb)

{
  uint uVar1;
  byte bVar2;
  uint uVar3;
  qsizetype qVar4;
  int iVar5;
  uint uVar6;
  int iVar7;
  QStyleSheetGeometryData *ptr;
  QSize QVar8;
  qsizetype qVar9;
  qsizetype qVar10;
  QRect *pQVar11;
  int iVar12;
  QStyleOption *in_RCX;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *old;
  QVariant *pQVar13;
  int iVar14;
  int iVar15;
  long lVar16;
  long lVar17;
  ulong uVar18;
  long lVar19;
  ButtonInfo *info_1;
  ButtonInfo *rule2;
  ButtonInfo *pBVar20;
  PrivateShared *pPVar21;
  long in_FS_OFFSET;
  QRect QVar22;
  QRect QVar23;
  QByteArrayView layout;
  QLatin1StringView sh;
  long lStack_2a0;
  long local_268;
  long local_258;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo> local_238;
  QArrayDataPointer<QVariant> local_218;
  ButtonInfo info;
  QRenderRule subRule;
  int offsets [3];
  undefined1 local_d0 [152];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *(undefined8 *)this = 0;
  uVar1 = *(uint *)&in_RCX[1].palette.d;
  memset(&subRule,0xaa,0x88);
  renderRule(&subRule,(QStyleSheetStyle *)w,(QObject *)tb,in_RCX,0);
  QVar22 = QRenderRule::contentsRect(&subRule,&in_RCX->rect);
  local_218.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_218.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_218.ptr = (QVariant *)&DAT_aaaaaaaaaaaaaaaa;
  sh.m_data = "button-layout";
  sh.m_size = 0xd;
  QRenderRule::styleHint((QVariant *)local_d0,&subRule,sh);
  ::QVariant::toList();
  ::QVariant::~QVariant((QVariant *)local_d0);
  if ((undefined1 *)local_218.size == (undefined1 *)0x0) {
    layout.m_data = "I(T)HSmMX";
    layout.m_size = 9;
    subControlLayout((QList<QVariant> *)local_d0,layout);
    QArrayDataPointer<QVariant>::operator=(&local_218,(QArrayDataPointer<QVariant> *)local_d0);
    QArrayDataPointer<QVariant>::~QArrayDataPointer((QArrayDataPointer<QVariant> *)local_d0);
  }
  offsets[2] = 0;
  offsets[0] = 0;
  offsets[1] = 0;
  local_238.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_238.ptr = (ButtonInfo *)&DAT_aaaaaaaaaaaaaaaa;
  local_d0._0_16_ =
       (undefined1  [16])
       QTypedArrayData<(anonymous_namespace)::ButtonInfo>::allocate(local_218.size,KeepSize);
  local_d0._16_8_ = 0;
  uVar18 = 0;
  QtPrivate::QGenericArrayOps<(anonymous_namespace)::ButtonInfo>::copyAppend
            ((QGenericArrayOps<(anonymous_namespace)::ButtonInfo> *)local_d0,(ButtonInfo *)0x0,
             (ButtonInfo *)0x0);
  if ((PrivateShared *)local_d0._0_8_ != (PrivateShared *)0x0) {
    *(PrivateShared *)(local_d0._0_8_ + 4) =
         (PrivateShared)((byte)*(PrivateShared *)(local_d0._0_8_ + 4) | 1);
  }
  local_238.d = (Data *)local_d0._0_8_;
  local_238.ptr = (ButtonInfo *)local_d0._8_8_;
  local_238.size = local_d0._16_8_;
  local_d0._0_16_ = ZEXT816(0);
  local_d0._16_8_ = 0;
  QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer
            ((QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)local_d0);
  lVar16 = local_218.size << 5;
  pQVar13 = local_218.ptr;
  while( true ) {
    pBVar20 = local_238.ptr;
    local_258 = QVar22._8_8_;
    local_268 = QVar22._0_8_;
    if (lVar16 == 0) break;
    iVar5 = ::QVariant::toInt((bool *)pQVar13);
    uVar6 = 2;
    if ((iVar5 == 0x28) || (uVar6 = 1, iVar5 == 0x29)) goto LAB_0033de3c;
    memset(&info,0xaa,0x98);
    QRenderRule::QRenderRule(&info.rule);
    uVar6 = (uint)uVar18;
    info.element = iVar5;
    switch(iVar5) {
    case 0x41:
      if (((ulong)in_RCX[1].palette.d & 0x300000000000) == 0) break;
      iVar5 = QFontMetrics::horizontalAdvance((QString *)&in_RCX->fontMetrics,(int)in_RCX + 0x48);
      info.width = iVar5 + 6;
      ptr = (QStyleSheetGeometryData *)operator_new(0x1c);
      iVar12 = QFontMetrics::height();
      ptr->super_QSharedData = (QAtomicInt)0x0;
      ptr->minWidth = -1;
      ptr->minHeight = -1;
      ptr->width = iVar5 + 6;
      ptr->height = iVar12;
      ptr->maxWidth = -1;
      ptr->maxHeight = -1;
      QSharedDataPointer<QStyleSheetGeometryData>::reset(&subRule.geo,ptr);
      goto LAB_0033dc93;
    case 0x42:
    case 0x49:
      bVar2 = *(byte *)((long)&in_RCX[1].palette.d + 5) & 0x20;
      goto joined_r0x0033db9b;
    case 0x43:
      if (((ulong)in_RCX[1].palette.d & 0x400000000000) == 0) break;
      iVar12 = 0x47;
      iVar5 = 0x43;
LAB_0033dc36:
      uVar3 = uVar1 & 1;
joined_r0x0033de57:
      if (uVar3 != 0) {
        iVar5 = iVar12;
        info.element = iVar12;
      }
      goto LAB_0033dc47;
    case 0x44:
      if (((ulong)in_RCX[1].palette.d & 0x800000000000) != 0) {
        iVar12 = 0x47;
        iVar5 = 0x44;
        uVar3 = uVar1 & 2;
        goto joined_r0x0033de57;
      }
      break;
    case 0x45:
      if (((ulong)in_RCX[1].palette.d & 0x2000000000000) != 0) {
        iVar12 = 0x46;
        iVar5 = 0x45;
        goto LAB_0033dc36;
      }
      break;
    case 0x48:
      bVar2 = *(byte *)((long)&in_RCX[1].palette.d + 6) & 1;
      iVar5 = 0x48;
joined_r0x0033db9b:
      if (bVar2 == 0) break;
LAB_0033dc47:
      renderRule((QRenderRule *)local_d0,(QStyleSheetStyle *)w,(QObject *)tb,in_RCX,iVar5);
      QRenderRule::operator=(&subRule,(QRenderRule *)local_d0);
      QRenderRule::~QRenderRule((QRenderRule *)local_d0);
      QVar8 = QRenderRule::size(&subRule);
      info.width = (int)QVar8.wd.m_i;
LAB_0033dc93:
      QRenderRule::operator=(&info.rule,&subRule);
      qVar4 = local_238.size;
      pPVar21 = (PrivateShared *)local_238.d;
      info.offset = offsets[uVar18];
      old = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
            (ulong)(uint)(info.offset + info.width);
      offsets[uVar18] = info.offset + info.width;
      info.where = uVar6;
      if (((PrivateShared *)local_238.d == (PrivateShared *)0x0) || (1 < *(int *)local_238.d)) {
LAB_0033dce6:
        memset((ButtonInfo *)local_d0,0xaa,0x98);
        anon_unknown.dwarf_511deb::ButtonInfo::ButtonInfo((ButtonInfo *)local_d0,&info);
        if ((pPVar21 == (PrivateShared *)0x0) || (1 < *(int *)pPVar21)) {
LAB_0033dd21:
          QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
                    (&local_238,GrowsAtEnd,1,old);
          qVar9 = local_238.size;
          pBVar20 = local_238.ptr;
        }
        else {
          qVar10 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::freeSpaceAtEnd(&local_238);
          qVar9 = qVar4;
          pBVar20 = local_238.ptr;
          if (qVar10 < 1) {
            old = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                  ((long)local_238.ptr - ((ulong)((Data *)pPVar21 + 0x1f) & 0xfffffffffffffff0));
            lVar17 = (long)old / -0x98;
            if (((long)old < 0x98) ||
               (old = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)
                      (*(long *)((Data *)pPVar21 + 8) * 2),
               SBORROW8(qVar4 * 3,(long)old) == qVar4 * 3 + *(long *)((Data *)pPVar21 + 8) * -2 < 0)
               ) goto LAB_0033dd21;
            pBVar20 = local_238.ptr + lVar17;
            if (local_238.ptr != (ButtonInfo *)0x0 && qVar4 != 0) {
              memmove(pBVar20,local_238.ptr,qVar4 * 0x98);
            }
          }
        }
        local_238.ptr = pBVar20;
        pBVar20 = local_238.ptr + qVar4;
        old = (QArrayDataPointer<(anonymous_namespace)::ButtonInfo> *)0x98;
        memmove(pBVar20 + 1,pBVar20,(qVar9 - qVar4) * 0x98);
        anon_unknown.dwarf_511deb::ButtonInfo::ButtonInfo(pBVar20,(ButtonInfo *)local_d0);
        local_238.size = local_238.size + 1;
        QRenderRule::~QRenderRule((QRenderRule *)local_d0);
        pPVar21 = (PrivateShared *)local_238.d;
        if ((PrivateShared *)local_238.d != (PrivateShared *)0x0) goto LAB_0033de0e;
LAB_0033de16:
        QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::reallocateAndGrow
                  (&local_238,GrowsAtEnd,0,old);
      }
      else {
        qVar9 = QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::freeSpaceAtEnd(&local_238);
        if (qVar9 == 0) {
          if ((qVar4 != 0) ||
             ((ButtonInfo *)((ulong)((Data *)pPVar21 + 0x1f) & 0xfffffffffffffff0) == local_238.ptr)
             ) goto LAB_0033dce6;
          pBVar20 = local_238.ptr + -1;
          anon_unknown.dwarf_511deb::ButtonInfo::ButtonInfo(pBVar20,&info);
          lStack_2a0 = 1;
          local_238.ptr = pBVar20;
          local_238.size = lStack_2a0;
        }
        else {
          anon_unknown.dwarf_511deb::ButtonInfo::ButtonInfo(local_238.ptr + qVar4,&info);
          local_238.size = qVar4 + 1;
        }
LAB_0033de0e:
        if (1 < *(int *)pPVar21) goto LAB_0033de16;
      }
      QRenderRule::~QRenderRule(&info.rule);
      goto LAB_0033de3c;
    }
    QRenderRule::~QRenderRule(&info.rule);
LAB_0033de3c:
    pQVar13 = pQVar13 + 1;
    lVar16 = lVar16 + -0x20;
    uVar18 = (ulong)uVar6;
  }
  iVar14 = QVar22.x2.m_i.m_i - offsets[1];
  lVar16 = (long)offsets[0];
  iVar12 = offsets[2] + -1;
  iVar15 = QVar22.y2.m_i.m_i - QVar22.y1.m_i;
  iVar5 = iVar15 / -2 + (int)(((local_258 >> 0x20) + (local_268 >> 0x20)) / 2);
  lVar17 = local_238.size * 0x98;
  lVar19 = 0;
  rule2 = local_238.ptr;
  do {
    if (lVar17 - lVar19 == 0) {
      QArrayDataPointer<(anonymous_namespace)::ButtonInfo>::~QArrayDataPointer(&local_238);
      QArrayDataPointer<QVariant>::~QArrayDataPointer(&local_218);
      QRenderRule::~QRenderRule(&subRule);
      if (*(long *)(in_FS_OFFSET + 0x28) != local_38) {
        __stack_chk_fail();
      }
      return (QHash<QStyle::SubControl,_QRect>)(Data *)this;
    }
    iVar7 = rule2->where;
    local_d0._4_12_ = QVar22._4_12_;
    if (iVar7 == 0) {
      iVar7 = *(int *)((long)&pBVar20->offset + lVar19) + QVar22.x1.m_i.m_i;
LAB_0033e06c:
      local_d0._0_4_ = iVar7;
      local_d0._8_4_ = iVar7 + *(int *)((long)&pBVar20->width + lVar19) + -1;
      local_d0._12_4_ = QVar22.y2.m_i.m_i;
    }
    else {
      if (iVar7 == 1) {
        iVar7 = *(int *)((long)&pBVar20->offset + lVar19) + iVar14 + 1;
        goto LAB_0033e06c;
      }
      local_d0._0_16_ = (undefined1  [16])QVar22;
      if (iVar7 == 2) {
        local_d0._0_4_ =
             *(int *)((long)&pBVar20->offset + lVar19) +
             iVar12 / -2 + (int)(((long)iVar14 + QVar22.x1.m_i.m_i + lVar16) / 2);
        local_d0._4_4_ = iVar5;
        local_d0._8_4_ = *(int *)((long)&pBVar20->width + lVar19) + local_d0._0_4_ + -1;
        local_d0._12_4_ = iVar15 + iVar5;
      }
    }
    info.rule.features = knownPseudoElements[rule2->element].subControl;
    QVar23 = positionRect((QStyleSheetStyle *)w,(QWidget *)tb,&rule2->rule,rule2->element,
                          (QRect *)local_d0,in_RCX->direction);
    pQVar11 = QHash<QStyle::SubControl,_QRect>::operator[]
                        ((QHash<QStyle::SubControl,_QRect> *)this,(SubControl *)&info);
    *pQVar11 = QVar23;
    rule2 = rule2 + 1;
    lVar19 = lVar19 + 0x98;
  } while( true );
}

Assistant:

QHash<QStyle::SubControl, QRect> QStyleSheetStyle::titleBarLayout(const QWidget *w, const QStyleOptionTitleBar *tb) const
{
    QHash<QStyle::SubControl, QRect> layoutRects;
    const bool isMinimized = tb->titleBarState & Qt::WindowMinimized;
    const bool isMaximized = tb->titleBarState & Qt::WindowMaximized;
    QRenderRule subRule = renderRule(w, tb);
    QRect cr = subRule.contentsRect(tb->rect);
    QList<QVariant> layout = subRule.styleHint("button-layout"_L1).toList();
    if (layout.isEmpty())
        layout = subControlLayout("I(T)HSmMX"_L1);

    int offsets[3] = { 0, 0, 0 };
    enum Where { Left, Right, Center, NoWhere } where = Left;
    QList<ButtonInfo> infos;
    infos.reserve(layout.size());
    for (const QVariant &val : std::as_const(layout)) {
        const int element = val.toInt();
        if (element == '(') {
            where = Center;
        } else if (element == ')') {
            where = Right;
        } else {
            ButtonInfo info;
            info.element = element;
            switch (element) {
            case PseudoElement_TitleBar:
                if (!(tb->titleBarFlags & (Qt::WindowTitleHint | Qt::WindowSystemMenuHint)))
                    continue;
                break;
            case PseudoElement_TitleBarContextHelpButton:
                if (!(tb->titleBarFlags & Qt::WindowContextHelpButtonHint))
                    continue;
                break;
            case PseudoElement_TitleBarMinButton:
                if (!(tb->titleBarFlags & Qt::WindowMinimizeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarMaxButton:
                if (!(tb->titleBarFlags & Qt::WindowMaximizeButtonHint))
                    continue;
                if (isMaximized)
                    info.element = PseudoElement_TitleBarNormalButton;
                break;
            case PseudoElement_TitleBarShadeButton:
                if (!(tb->titleBarFlags & Qt::WindowShadeButtonHint))
                    continue;
                if (isMinimized)
                    info.element = PseudoElement_TitleBarUnshadeButton;
                break;
            case PseudoElement_TitleBarCloseButton:
            case PseudoElement_TitleBarSysMenu:
                if (!(tb->titleBarFlags & Qt::WindowSystemMenuHint))
                    continue;
                break;
            default:
                continue;
            }
            if (info.element == PseudoElement_TitleBar) {
                info.width = tb->fontMetrics.horizontalAdvance(tb->text) + 6;
                subRule.geo = new QStyleSheetGeometryData(info.width, tb->fontMetrics.height(), -1, -1, -1, -1);
            } else {
                subRule = renderRule(w, tb, info.element);
                info.width = subRule.size().width();
            }
            info.rule = subRule;
            info.offset = offsets[where];
            info.where = where;
            offsets[where] += info.width;

            infos.append(std::move(info));
        }
    }

    for (const ButtonInfo &info : std::as_const(infos)) {
        QRect lr = cr;
        switch (info.where) {
        case Center: {
            lr.setLeft(cr.left() + offsets[Left]);
            lr.setRight(cr.right() - offsets[Right]);
            QRect r(0, 0, offsets[Center], lr.height());
            r.moveCenter(lr.center());
            r.setLeft(r.left()+info.offset);
            r.setWidth(info.width);
            lr = r;
            break; }
        case Left:
            lr.translate(info.offset, 0);
            lr.setWidth(info.width);
            break;
        case Right:
            lr.moveLeft(cr.right() + 1 - offsets[Right] + info.offset);
            lr.setWidth(info.width);
            break;
        default:
            break;
        }
        QStyle::SubControl control = knownPseudoElements[info.element].subControl;
        layoutRects[control] = positionRect(w, info.rule, info.element, lr, tb->direction);
    }

    return layoutRects;
}